

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O1

bool __thiscall raptor::TcpServer::CloseConnection(TcpServer *this,ConnectionId cid)

{
  uint32_t index;
  shared_ptr<raptor::Connection> con;
  IAcceptor local_28;
  IEpollReceiver local_20;
  
  index = 0xffffffff;
  if (((cid != 0xffffffffffffffff) && (this->_magic_number == (uint16_t)(cid >> 0x30))) &&
     (index = 0xffffffff, (cid & 0xffffffff) < (this->_options).max_connections)) {
    index = (uint32_t)cid;
  }
  if (index != 0xffffffff) {
    GetConnection((TcpServer *)&stack0xffffffffffffffd8,(uint32_t)this);
    if ((Connection *)local_28._vptr_IAcceptor != (Connection *)0x0) {
      Connection::Shutdown((Connection *)local_28._vptr_IAcceptor,false);
      DeleteConnection(this,index);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IEpollReceiver !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IEpollReceiver);
    }
  }
  return index != 0xffffffff;
}

Assistant:

bool TcpServer::CloseConnection(ConnectionId cid){
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return false;
    }

    auto con = GetConnection(index);
    if (con) {
        con->Shutdown(false);
        DeleteConnection(index);
    }
    return true;
}